

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O2

bool __thiscall ON_PolylineCurve::ChangeClosedCurveSeam(ON_PolylineCurve *this,double t)

{
  double t1;
  ON_3dPoint *pOVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  double *pdVar6;
  size_t c;
  long lVar7;
  double dVar8;
  double local_d8;
  double k;
  ON_Interval old_dom;
  ON_SimpleArray<double> new_t;
  ON_SimpleArray<ON_3dPoint> new_pt;
  ON_3dPoint new_start;
  ON_Interval span_domain;
  ON_SimpleArray<ON_3dPoint> local_48;
  
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  iVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])(this);
  if ((char)iVar4 == '\0') {
LAB_0059c4d8:
    bVar3 = false;
  }
  else {
    k = t;
    bVar3 = ON_Interval::Includes(&old_dom,t,false);
    local_d8 = t;
    if (!bVar3) {
      dVar8 = ON_Interval::NormalizedParameterAt(&old_dom,t);
      dVar8 = fmod(dVar8,1.0);
      local_d8 = ON_Interval::ParameterAt
                           (&old_dom,(double)(~-(ulong)(dVar8 < 0.0) & (ulong)dVar8 |
                                             (ulong)(dVar8 + 1.0) & -(ulong)(dVar8 < 0.0)));
      k = local_d8;
    }
    bVar3 = ON_Interval::Includes(&old_dom,local_d8,true);
    if (bVar3) {
      iVar4 = ON_Polyline::PointCount(&this->m_pline);
      uVar5 = ON_NurbsSpanIndex(2,iVar4,(this->m_t).m_a,local_d8,0,0);
      pdVar6 = (this->m_t).m_a;
      dVar8 = pdVar6[(int)uVar5];
      if ((local_d8 < dVar8) || (t1 = pdVar6[(long)(int)uVar5 + 1], t1 <= local_d8))
      goto LAB_0059c4d8;
      ON_Interval::ON_Interval(&span_domain,dVar8,t1);
      dVar8 = ON_Interval::NormalizedParameterAt(&span_domain,local_d8);
      if (dVar8 <= 1.7763568394002505e-15) {
        pdVar6 = ON_Interval::operator[](&span_domain,0);
        local_d8 = *pdVar6;
        k = local_d8;
      }
      else if (0.9999999999999982 <= dVar8) {
        pdVar6 = ON_Interval::operator[](&span_domain,1);
        local_d8 = *pdVar6;
        k = local_d8;
        uVar5 = ON_NurbsSpanIndex(2,iVar4,(this->m_t).m_a,local_d8,0,0);
      }
      dVar8 = ON_Interval::operator[](&old_dom,0);
      if ((local_d8 != dVar8) || (NAN(local_d8) || NAN(dVar8))) {
        dVar8 = ON_Interval::operator[](&old_dom,1);
        if ((local_d8 != dVar8) || (NAN(local_d8) || NAN(dVar8))) {
          uVar2 = (uint)((this->m_t).m_a[(int)uVar5] != local_d8);
          c = (size_t)(int)(iVar4 + uVar2);
          ON_SimpleArray<ON_3dPoint>::ON_SimpleArray(&new_pt,c);
          ON_SimpleArray<double>::ON_SimpleArray(&new_t,c);
          pdVar6 = (this->m_t).m_a + (int)uVar5;
          if ((local_d8 != *pdVar6) || (NAN(local_d8) || NAN(*pdVar6))) {
            ON_Curve::PointAt(&new_start,&this->super_ON_Curve,local_d8);
          }
          else {
            pOVar1 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
            new_start.z = pOVar1[(int)uVar5].z;
            pOVar1 = pOVar1 + (int)uVar5;
            new_start.x = pOVar1->x;
            new_start.y = pOVar1->y;
          }
          ON_SimpleArray<ON_3dPoint>::Append(&new_pt,&new_start);
          ON_SimpleArray<double>::Append(&new_t,&k);
          ON_SimpleArray<ON_3dPoint>::Append
                    (&new_pt,iVar4 + ~uVar5,
                     (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a +
                     (long)(int)uVar5 + 1);
          ON_SimpleArray<double>::Append
                    (&new_t,iVar4 + ~uVar5,(this->m_t).m_a + (long)(int)uVar5 + 1);
          lVar7 = (long)new_t.m_count;
          iVar4 = uVar5 + (-uVar2 & 1) + -1;
          ON_SimpleArray<ON_3dPoint>::Append
                    (&new_pt,iVar4,
                     (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a + 1)
          ;
          ON_SimpleArray<double>::Append(&new_t,iVar4,(this->m_t).m_a + 1);
          ON_SimpleArray<ON_3dPoint>::Append(&new_pt,&new_start);
          ON_SimpleArray<double>::Append(&new_t,&k);
          dVar8 = ON_Interval::Length(&old_dom);
          for (; lVar7 < new_t.m_count; lVar7 = lVar7 + 1) {
            new_t.m_a[lVar7] = new_t.m_a[lVar7] + dVar8;
          }
          ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_48,&new_pt);
          ON_Polyline::operator=(&this->m_pline,(ON_3dPointArray *)&local_48);
          ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_48);
          ON_SimpleArray<double>::operator=(&this->m_t,&new_t);
          ON_SimpleArray<double>::~ON_SimpleArray(&new_t);
          ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&new_pt);
        }
      }
    }
    dVar8 = ON_Interval::operator[](&old_dom,0);
    if ((dVar8 != t) || (NAN(dVar8) || NAN(t))) {
      dVar8 = ON_Interval::Length(&old_dom);
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (t,dVar8 + t,this);
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool ON_PolylineCurve::ChangeClosedCurveSeam( double t )
{
  const ON_Interval old_dom = Domain();
  bool rc = IsClosed();
  if ( rc )
  {
    double k = t;

    if ( !old_dom.Includes(t) )
    {
      // If you know why this is here, please add
      // a bug reference so we can retest when this code
      // is cleaned up.  It needs to be cleaned up.
      double s = old_dom.NormalizedParameterAt(t);
      s = fmod(s,1.0);
      if ( s < 0.0 )
        s += 1.0;
      k = old_dom.ParameterAt(s);
    }



    if ( old_dom.Includes(k,true) )
    {
      int old_count = PointCount();
      int i = ON_NurbsSpanIndex(2,old_count,m_t.Array(),k,0,0);
      if ( k < m_t[i] )
        return false;
      if ( k >= m_t[i+1] )
        return false;

      // 20 Feb 2014 Dale L & Lowell - This was making a new point in the polyline
      // when the seam was changed to a t within eps of an existing point.
      // This change snaps the t to existing points if it is within normalized_span_tol
      // of one that already exists. ON_EPSILON didn't quite work but 8 * ON_EPSILON does
      // comparing t = 4149.8519999999990 to m_t[1] = 4149.8519999999980 in RH-24591
      ON_Interval span_domain(m_t[i],m_t[i+1]);
      double s = span_domain.NormalizedParameterAt(k);
      double normalized_span_tol = 8.0*ON_EPSILON;
      if ( s <= normalized_span_tol )
      {
        k = span_domain[0];
      }
      else if ( s >= 1.0 - normalized_span_tol )
      {
        k = span_domain[1];
        i = ON_NurbsSpanIndex(2,old_count,m_t.Array(),k,0,0);
      }

      if ( k == old_dom[0] || k == old_dom[1] )
      {
        // k already at start end of this curve
        rc = true;
      }
      else
      {
        int new_count = (k==m_t[i]) ? old_count : old_count+1;
        ON_SimpleArray<ON_3dPoint> new_pt(new_count);
        ON_SimpleArray<double> new_t(new_count);
        ON_3dPoint new_start = (k==m_t[i]) ? m_pline[i] : PointAt(k);
        new_pt.Append( new_start );
        new_t.Append(k);
        int n = old_count-i-1;
        new_pt.Append( n, m_pline.Array() + i+1 );
        new_t.Append( n, m_t.Array() + i+1 );
      
        int j = new_t.Count();

        n = new_count-old_count+i-1;
        new_pt.Append( n, m_pline.Array() + 1 );
        new_t.Append(  n, m_t.Array() + 1 );

        new_pt.Append( new_start );
        new_t.Append(k);

        double d = old_dom.Length();
        while ( j  < new_t.Count() )
        {
          new_t[j] += d;
          j++;
        }

        m_pline = new_pt;
        m_t = new_t;
      }
    }
    else
    {
      // k already at start end of this curve
      rc = true;
    }

    if ( rc  && t != old_dom[0] )
      SetDomain( t, t + old_dom.Length() );
  }
  return rc;
}